

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O3

_Bool oonf_layer2_neigh_remove(oonf_layer2_neigh *l2neigh,oonf_layer2_origin *origin)

{
  uint8_t *puVar1;
  list_entity *plVar2;
  byte bVar3;
  int iVar4;
  list_entity *plVar5;
  long lVar6;
  byte bVar7;
  list_entity *plVar8;
  
  if ((l2neigh->_node).list.next == (list_entity *)0x0) {
    return false;
  }
  if ((l2neigh->_node).list.prev != (list_entity *)0x0) {
    plVar8 = (l2neigh->destinations).list_head.next;
    plVar5 = (l2neigh->destinations).list_head.prev;
    if (plVar8->prev == plVar5) {
      bVar7 = 0;
    }
    else {
      bVar7 = 0;
      do {
        plVar2 = plVar8->next;
        if ((oonf_layer2_origin *)plVar8[-1].prev == origin) {
          oonf_layer2_destination_remove((oonf_layer2_destination *)&plVar8[-3].prev);
          plVar5 = (l2neigh->destinations).list_head.prev;
          bVar7 = 1;
        }
        plVar8 = plVar2;
      } while (plVar2->prev != plVar5);
    }
    plVar8 = (l2neigh->remote_neighbor_ips).list_head.next;
    plVar5 = plVar8->prev;
    while (plVar5 != (l2neigh->remote_neighbor_ips).list_head.prev) {
      plVar2 = plVar8->next;
      iVar4 = oonf_layer2_neigh_remove_ip((oonf_layer2_neighbor_address *)(plVar8 + -6),origin);
      bVar7 = bVar7 | iVar4 == 0;
      plVar8 = plVar2;
      plVar5 = plVar2->prev;
    }
    lVar6 = 0xd0;
    bVar3 = 0;
    do {
      if (*(oonf_layer2_origin **)((l2neigh->key).addr._addr + lVar6) == origin) {
        puVar1 = (l2neigh->key).addr._addr + lVar6 + -8;
        puVar1[0] = '\0';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        puVar1[4] = '\0';
        puVar1[5] = '\0';
        puVar1[6] = '\0';
        puVar1[7] = '\0';
        puVar1[8] = '\0';
        puVar1[9] = '\0';
        puVar1[10] = '\0';
        puVar1[0xb] = '\0';
        puVar1[0xc] = '\0';
        puVar1[0xd] = '\0';
        puVar1[0xe] = '\0';
        puVar1[0xf] = '\0';
        bVar3 = 1;
      }
      lVar6 = lVar6 + 0x28;
    } while (lVar6 != 0x4e0);
    if ((bool)(bVar3 | bVar7)) {
      oonf_layer2_neigh_commit(l2neigh);
      return true;
    }
  }
  return false;
}

Assistant:

static INLINE bool
list_is_node_added(const struct list_entity *node) {
  return node->next != NULL && node->prev != NULL;
}